

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myHashMap.h
# Opt level: O3

void __thiscall
myHashMap<wallet>::myHashMap
          (myHashMap<wallet> *this,uint tableSize,_func_uint_myString_ptr_uint *hashF)

{
  undefined8 *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  
  this->tableSize = tableSize;
  uVar4 = (ulong)tableSize;
  puVar2 = (ulong *)operator_new__(uVar4 * 0x28 + 8);
  *puVar2 = uVar4;
  if (tableSize != 0) {
    lVar3 = 0;
    do {
      *(undefined ***)((long)puVar2 + lVar3 + 8) = &PTR__linkedList_0010ebc8;
      puVar1 = (undefined8 *)((long)puVar2 + lVar3 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)puVar2 + lVar3 + 0x20) = 0;
      *(undefined4 *)((long)puVar2 + lVar3 + 0x28) = 0;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 * 0x28 != lVar3);
  }
  this->table = (myBucket_chain<wallet> *)(puVar2 + 1);
  this->hashFunc = hashF;
  return;
}

Assistant:

myHashMap(unsigned tableSize ,unsigned (*hashF)(const myString&, unsigned )) {

        this->tableSize = tableSize;

        this->table = new myBucket_chain<T>  [tableSize] ;

        this->hashFunc = hashF;

    }